

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_q5_0(block_q5_0 *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  
  uVar6 = 0;
  uVar4 = k / 0x20 & 0xffffffff;
  if ((int)(k / 0x20) < 1) {
    uVar4 = uVar6;
  }
  puVar7 = x->qs;
  for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
    uVar8 = (ulong)((uint)uVar6 & 0x7ffffff);
    fVar1 = ggml_table_f32_f16[x[uVar6].d];
    uVar3 = *(uint *)x[uVar6].qh;
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      bVar2 = puVar7[lVar5];
      y[uVar8 * 0x20 + lVar5] =
           (float)(int)((uVar3 >> ((byte)lVar5 & 0x1f) & 1) * 0x10 + (bVar2 & 0xf) + -0x10) * fVar1;
      y[uVar8 * 0x20 + lVar5 + 0x10] =
           (float)(int)((uint)(bVar2 >> 4) + (uVar3 >> ((byte)lVar5 + 0xc & 0x1f) & 0x10) + -0x10) *
           fVar1;
    }
    puVar7 = puVar7 + 0x16;
  }
  return;
}

Assistant:

void dequantize_row_q5_0(const block_q5_0 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    static const int qk = QK5_0;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);

        uint32_t qh;
        memcpy(&qh, x[i].qh, sizeof(qh));

        for (int j = 0; j < qk/2; ++j) {
            const uint8_t xh_0 = ((qh >> (j +  0)) << 4) & 0x10;
            const uint8_t xh_1 = ((qh >> (j + 12))     ) & 0x10;

            const int32_t x0 = ((x[i].qs[j] & 0x0F) | xh_0) - 16;
            const int32_t x1 = ((x[i].qs[j] >>   4) | xh_1) - 16;

            y[i*qk + j + 0   ] = x0*d;
            y[i*qk + j + qk/2] = x1*d;
        }
    }
}